

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

SynchEvent *
absl::lts_20250127::EnsureSynchEvent(atomic<long> *addr,char *name,intptr_t bits,intptr_t lockbit)

{
  int *piVar1;
  ulong uVar2;
  int *v;
  uint uVar3;
  size_t sVar4;
  SynchEvent *pSVar5;
  char *pcVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar3 = synch_event_mu;
  pcVar6 = (char *)0x3f90c2ab542cb1c9;
  if ((synch_event_mu & 1) == 0) {
    synch_event_mu = synch_event_mu | 1;
    pcVar6 = (char *)(ulong)synch_event_mu;
    LOCK();
    UNLOCK();
  }
  if ((uVar3 & 1) != 0) {
    base_internal::SpinLock::SlowLock((SpinLock *)&synch_event_mu);
  }
  EnsureSynchEvent::synch_event_count = EnsureSynchEvent::synch_event_count + 1;
  if (0x19000 < EnsureSynchEvent::synch_event_count) {
    EnsureSynchEvent::synch_event_count = 0;
    pcVar6 = 
    "Accumulated %zu Mutex debug objects. If you see this in production, it may mean that the production code accidentally calls Mutex/CondVar::EnableDebugLog/EnableInvariantDebugging."
    ;
    lVar8 = 0;
    raw_log_internal::RawLog
              (kError,"mutex.cc",0x166,
               "Accumulated %zu Mutex debug objects. If you see this in production, it may mean that the production code accidentally calls Mutex/CondVar::EnableDebugLog/EnableInvariantDebugging."
               ,0x19000);
    do {
      piVar1 = *(int **)((long)&synch_event + lVar8);
      while (v = piVar1, v != (int *)0x0) {
        piVar1 = *(int **)(v + 2);
        *v = *v + -1;
        if (*v == 0) {
          base_internal::LowLevelAlloc::Free(v);
        }
      }
      *(undefined8 *)((long)&synch_event + lVar8) = 0;
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x2038);
  }
  uVar9 = (ulong)addr % 0x407;
  do {
    uVar2 = (addr->super___atomic_base<long>)._M_i;
    if ((bits & ~uVar2) == 0) {
      bVar10 = true;
      pcVar6 = (char *)0x0;
    }
    else if ((uVar2 & lockbit) == 0) {
      LOCK();
      bVar10 = uVar2 == (addr->super___atomic_base<long>)._M_i;
      if (bVar10) {
        (addr->super___atomic_base<long>)._M_i = uVar2 | bits;
      }
      UNLOCK();
      pcVar6 = (char *)(ulong)(byte)((byte)pcVar6 | bVar10);
    }
    else {
      bVar10 = false;
    }
  } while (!bVar10);
  if (((ulong)pcVar6 & 1) == 0) {
    for (pSVar5 = (SynchEvent *)(&synch_event)[uVar9]; pSVar5 != (SynchEvent *)0x0;
        pSVar5 = pSVar5->next) {
      if ((pSVar5->masked_addr ^ (ulong)addr) == 0xf03a5f7bf03a5f7b) goto LAB_002b02e1;
    }
  }
  pSVar5 = (SynchEvent *)0x0;
LAB_002b02e1:
  if (pSVar5 == (SynchEvent *)0x0) {
    pcVar6 = "";
    if (name != (char *)0x0) {
      pcVar6 = name;
    }
    sVar4 = strlen(pcVar6);
    pSVar5 = (SynchEvent *)base_internal::LowLevelAlloc::Alloc(sVar4 + 0x30);
    pSVar5->refcount = 2;
    pSVar5->masked_addr = (ulong)addr ^ 0xf03a5f7bf03a5f7b;
    pSVar5->invariant = (_func_void_void_ptr *)0x0;
    pSVar5->arg = (void *)0x0;
    pSVar5->log = false;
    strcpy(pSVar5->name,pcVar6);
    pSVar5->next = (SynchEvent *)(&synch_event)[uVar9];
    (&synch_event)[uVar9] = pSVar5;
  }
  else {
    pSVar5->refcount = pSVar5->refcount + 1;
  }
  uVar3 = synch_event_mu;
  uVar7 = synch_event_mu & 2;
  LOCK();
  UNLOCK();
  bVar10 = 7 < synch_event_mu;
  synch_event_mu = uVar7;
  if (bVar10) {
    base_internal::SpinLock::SlowUnlock((SpinLock *)&synch_event_mu,uVar3);
  }
  return pSVar5;
}

Assistant:

static SynchEvent* EnsureSynchEvent(std::atomic<intptr_t>* addr,
                                    const char* name, intptr_t bits,
                                    intptr_t lockbit) {
  uint32_t h = reinterpret_cast<uintptr_t>(addr) % kNSynchEvent;
  synch_event_mu.Lock();
  // When a Mutex/CondVar is destroyed, we don't remove the associated
  // SynchEvent to keep destructors empty in release builds for performance
  // reasons. If the current call is the first to set bits (kMuEvent/kCVEvent),
  // we don't look up the existing even because (if it exists, it must be for
  // the previous Mutex/CondVar that existed at the same address).
  // The leaking events must not be a problem for tests, which should create
  // bounded amount of events. And debug logging is not supposed to be enabled
  // in production. However, if it's accidentally enabled, or briefly enabled
  // for some debugging, we don't want to crash the program. Instead we drop
  // all events, if we accumulated too many of them. Size of a single event
  // is ~48 bytes, so 100K events is ~5 MB.
  // Additionally we could delete the old event for the same address,
  // but it would require a better hashmap (if we accumulate too many events,
  // linked lists will grow and traversing them will be very slow).
  constexpr size_t kMaxSynchEventCount = 100 << 10;
  // Total number of live synch events.
  static size_t synch_event_count ABSL_GUARDED_BY(synch_event_mu);
  if (++synch_event_count > kMaxSynchEventCount) {
    synch_event_count = 0;
    ABSL_RAW_LOG(ERROR,
                 "Accumulated %zu Mutex debug objects. If you see this"
                 " in production, it may mean that the production code"
                 " accidentally calls "
                 "Mutex/CondVar::EnableDebugLog/EnableInvariantDebugging.",
                 kMaxSynchEventCount);
    for (auto*& head : synch_event) {
      for (auto* e = head; e != nullptr;) {
        SynchEvent* next = e->next;
        if (--(e->refcount) == 0) {
          base_internal::LowLevelAlloc::Free(e);
        }
        e = next;
      }
      head = nullptr;
    }
  }
  SynchEvent* e = nullptr;
  if (!AtomicSetBits(addr, bits, lockbit)) {
    for (e = synch_event[h];
         e != nullptr && e->masked_addr != base_internal::HidePtr(addr);
         e = e->next) {
    }
  }
  if (e == nullptr) {  // no SynchEvent struct found; make one.
    if (name == nullptr) {
      name = "";
    }
    size_t l = strlen(name);
    e = reinterpret_cast<SynchEvent*>(
        base_internal::LowLevelAlloc::Alloc(sizeof(*e) + l));
    e->refcount = 2;  // one for return value, one for linked list
    e->masked_addr = base_internal::HidePtr(addr);
    e->invariant = nullptr;
    e->arg = nullptr;
    e->log = false;
    strcpy(e->name, name);  // NOLINT(runtime/printf)
    e->next = synch_event[h];
    synch_event[h] = e;
  } else {
    e->refcount++;  // for return value
  }
  synch_event_mu.Unlock();
  return e;
}